

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O0

int32_t ulocimp_getLanguage_63(char *localeID,char *language,int32_t languageCapacity,char **pEnd)

{
  char cVar1;
  int16_t iVar2;
  int32_t iVar3;
  bool bVar4;
  char local_34 [4];
  int local_30;
  char lang [4];
  int32_t offset;
  int32_t i;
  char **pEnd_local;
  int32_t languageCapacity_local;
  char *language_local;
  char *localeID_local;
  
  lang[0] = '\0';
  lang[1] = '\0';
  lang[2] = '\0';
  lang[3] = '\0';
  memset(local_34,0,4);
  language_local = localeID;
  if (((((*localeID == 'x') || (*localeID == 'X')) || (*localeID == 'i')) || (*localeID == 'I')) &&
     ((localeID[1] == '_' || (localeID[1] == '-')))) {
    if ((int)lang < languageCapacity) {
      cVar1 = uprv_asciitolower_63(*localeID);
      language[(int)lang] = cVar1;
    }
    if ((int)lang < languageCapacity) {
      language[(int)lang + 1] = '-';
    }
    lang = (char  [4])((int)lang + 2);
    language_local = localeID + 2;
  }
  while( true ) {
    bVar4 = false;
    if (((*language_local != '\0') && (bVar4 = false, *language_local != '.')) &&
       (bVar4 = false, *language_local != '@')) {
      bVar4 = true;
      if (*language_local != '_') {
        bVar4 = *language_local == '-';
      }
      bVar4 = (bool)(bVar4 ^ 1);
    }
    if (!bVar4) break;
    if ((int)lang < languageCapacity) {
      cVar1 = uprv_asciitolower_63(*language_local);
      language[(int)lang] = cVar1;
    }
    if ((int)lang < 3) {
      cVar1 = uprv_asciitolower_63(*language_local);
      local_34[(int)lang] = cVar1;
    }
    lang = (char  [4])((int)lang + 1);
    language_local = language_local + 1;
  }
  if (lang == (char  [4])0x3) {
    iVar2 = _findIndex(LANGUAGES_3,local_34);
    local_30 = (int)iVar2;
    if (-1 < local_30) {
      lang = (char  [4])_copyCount(language,languageCapacity,LANGUAGES[local_30]);
    }
  }
  if (pEnd != (char **)0x0) {
    *pEnd = language_local;
  }
  iVar3._0_1_ = lang[0];
  iVar3._1_1_ = lang[1];
  iVar3._2_1_ = lang[2];
  iVar3._3_1_ = lang[3];
  return iVar3;
}

Assistant:

U_CFUNC int32_t
ulocimp_getLanguage(const char *localeID,
                    char *language, int32_t languageCapacity,
                    const char **pEnd) {
    int32_t i=0;
    int32_t offset;
    char lang[4]={ 0, 0, 0, 0 }; /* temporary buffer to hold language code for searching */

    /* if it starts with i- or x- then copy that prefix */
    if(_isIDPrefix(localeID)) {
        if(i<languageCapacity) {
            language[i]=(char)uprv_tolower(*localeID);
        }
        if(i<languageCapacity) {
            language[i+1]='-';
        }
        i+=2;
        localeID+=2;
    }

    /* copy the language as far as possible and count its length */
    while(!_isTerminator(*localeID) && !_isIDSeparator(*localeID)) {
        if(i<languageCapacity) {
            language[i]=(char)uprv_tolower(*localeID);
        }
        if(i<3) {
            U_ASSERT(i>=0);
            lang[i]=(char)uprv_tolower(*localeID);
        }
        i++;
        localeID++;
    }

    if(i==3) {
        /* convert 3 character code to 2 character code if possible *CWB*/
        offset=_findIndex(LANGUAGES_3, lang);
        if(offset>=0) {
            i=_copyCount(language, languageCapacity, LANGUAGES[offset]);
        }
    }

    if(pEnd!=NULL) {
        *pEnd=localeID;
    }
    return i;
}